

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O3

bool __thiscall
double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  bool sign;
  int decimal_point;
  char decimal_rep [121];
  uint local_c4;
  bool local_bd;
  undefined4 local_bc;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined1 uStack_50;
  undefined7 local_4f;
  undefined1 uStack_48;
  undefined1 *puStack_47;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      bVar3 = HandleSpecialValues(this,value,result_builder);
      return bVar3;
    }
    goto LAB_003dd80f;
  }
  if (precision - 0x79U < 0xffffff88) {
    bVar3 = false;
  }
  else {
    local_bc = 0xaaaaaaaa;
    local_bd = true;
    uStack_48 = 0xaa;
    puStack_47 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
    uStack_50 = 0xaa;
    local_4f = 0xaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
    local_c4 = 0xaaaaaaaa;
    DoubleToAscii(value,PRECISION,precision,(char *)&local_b8,0x79,&local_bd,(int *)&local_c4,
                  &local_bc);
    if ((local_bd == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
      iVar7 = *(int *)(result_builder + 0x10);
      *(int *)(result_builder + 0x10) = iVar7 + 1;
      *(undefined1 *)(*(long *)result_builder + (long)iVar7) = 0x2d;
    }
    uVar4 = 1;
    uVar5 = this->flags_;
    if (this->max_leading_padding_zeroes_in_precision_mode_ < (int)(1 - local_bc)) {
      bVar3 = true;
      if ((uVar5 & 0x10) != 0) {
LAB_003dd773:
        uVar6 = (ulong)local_c4;
        uVar5 = local_c4;
        if (((int)uVar4 < (int)local_c4) && (*(char *)((long)&local_bc + uVar6 + 3) == '0')) {
          uVar1 = uVar6;
          do {
            local_c4 = (int)uVar6 - 1;
            uVar6 = (ulong)local_c4;
            uVar5 = uVar4;
            if ((long)(uVar1 - 1) <= (long)(ulong)uVar4) break;
            lVar2 = uVar1 + 2;
            uVar5 = local_c4;
            uVar1 = uVar1 - 1;
          } while (*(char *)((long)&local_bc + lVar2) == '0');
        }
        if ((int)uVar5 < precision) {
          precision = uVar5;
        }
        if (!bVar3) goto LAB_003dd735;
      }
LAB_003dd7ab:
      iVar7 = local_bc - 1;
      if ((int)local_c4 < precision) {
        memset((void *)((long)&local_b8 + (long)(int)local_c4),0x30,
               (ulong)(~local_c4 + precision) + 1);
      }
      CreateExponentialRepresentation(this,(char *)&local_b8,precision,iVar7,result_builder);
    }
    else {
      iVar7 = (local_bc - precision) + (uint)((uVar5 >> 2 & 1) != 0);
      if ((uVar5 & 0x10) != 0) {
        if (this->max_trailing_padding_zeroes_in_precision_mode_ < iVar7) {
          uVar4 = 1;
          bVar3 = true;
        }
        else {
          uVar4 = 1;
          if (1 < (int)local_bc) {
            uVar4 = local_bc;
          }
          bVar3 = false;
        }
        goto LAB_003dd773;
      }
      if (this->max_trailing_padding_zeroes_in_precision_mode_ < iVar7) goto LAB_003dd7ab;
LAB_003dd735:
      iVar7 = 0;
      if (0 < (int)(precision - local_bc)) {
        iVar7 = precision - local_bc;
      }
      CreateDecimalRepresentation(this,(char *)&local_b8,local_c4,local_bc,iVar7,result_builder);
    }
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
LAB_003dd80f:
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  bool as_exponential =
      (-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_);
  if ((flags_ & NO_TRAILING_ZERO) != 0) {
    // Truncate trailing zeros that occur after the decimal point (if exponential,
    // that is everything after the first digit).
    int stop = as_exponential ? 1 : std::max(1, decimal_point);
    while (decimal_rep_length > stop && decimal_rep[decimal_rep_length - 1] == '0') {
      --decimal_rep_length;
    }
    // Clamp precision to avoid the code below re-adding the zeros.
    precision = std::min(precision, decimal_rep_length);
  }
  if (as_exponential) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                (std::max)(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}